

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::ListDatatypeValidator::valueSpaceCheck
          (ListDatatypeValidator *this,BaseRefVectorOf<char16_t> *tokenVector,XMLCh *enumStr,
          MemoryManager *manager)

{
  int iVar1;
  BaseRefVectorOf<char16_t> *this_00;
  char16_t *pcVar2;
  char16_t *pcVar3;
  uint uVar4;
  XMLSize_t getAt;
  bool bVar5;
  
  do {
    this = (ListDatatypeValidator *)
           (this->super_AbstractStringValidator).super_DatatypeValidator.fBaseValidator;
  } while ((this->super_AbstractStringValidator).super_DatatypeValidator.fType == List);
  this_00 = XMLString::tokenizeString(enumStr,manager);
  if (tokenVector->fCurCount == this_00->fCurCount) {
    bVar5 = tokenVector->fCurCount == 0;
    if (!bVar5) {
      uVar4 = 1;
      getAt = 0;
      do {
        pcVar2 = BaseRefVectorOf<char16_t>::elementAt(tokenVector,getAt);
        pcVar3 = BaseRefVectorOf<char16_t>::elementAt(this_00,getAt);
        iVar1 = (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
                  _vptr_XSerializable[10])(this,pcVar2,pcVar3,manager);
        if (iVar1 != 0) break;
        getAt = (XMLSize_t)uVar4;
        uVar4 = uVar4 + 1;
        bVar5 = tokenVector->fCurCount <= getAt;
      } while (getAt < tokenVector->fCurCount);
    }
  }
  else {
    bVar5 = false;
  }
  if (this_00 != (BaseRefVectorOf<char16_t> *)0x0) {
    (*this_00->_vptr_BaseRefVectorOf[1])();
  }
  return bVar5;
}

Assistant:

bool ListDatatypeValidator::valueSpaceCheck(BaseRefVectorOf<XMLCh>* tokenVector
                                          , const XMLCh*    const  enumStr
                                          , MemoryManager*  const  manager) const
{
    DatatypeValidator* theItemTypeDTV = getItemTypeDTV();
    BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(enumStr, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janName(enumVector);

    if (tokenVector->size() != enumVector->size())
        return false;

    for ( unsigned int j = 0; j < tokenVector->size(); j++ )
    {
        if (theItemTypeDTV->compare(tokenVector->elementAt(j), enumVector->elementAt(j), manager) != 0)
            return false;
    }

    return true;
}